

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Imputer::MergePartialFromCodedStream(Imputer *this,CodedInputStream *input)

{
  ImputedValueUnion *this_00;
  byte bVar1;
  byte *pbVar2;
  ImputedValueUnion *pIVar3;
  uint8 *puVar4;
  ReplaceValueUnion *pRVar5;
  bool bVar6;
  uint32 uVar7;
  int iVar8;
  unsigned_long uVar9;
  StringToDoubleMap *this_01;
  Int64ToDoubleMap *this_02;
  DoubleVector *pDVar10;
  Int64Vector *this_03;
  pair<int,_int> pVar11;
  char *field_name;
  char cVar12;
  ulong uVar13;
  ReplaceValueUnion value;
  _func_int **data;
  DoubleVector *pDVar14;
  undefined8 *puVar15;
  ImputedValueUnion IVar16;
  pair<unsigned_long,_bool> pVar17;
  ImputedValueUnion local_40;
  ReplaceValueUnion *local_38;
  
  local_38 = &this->ReplaceValue_;
  this_00 = &this->ImputedValue_;
LAB_001e92ae:
  pbVar2 = input->buffer_;
  uVar7 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar7 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_001e92d1;
    input->buffer_ = pbVar2 + 1;
    uVar13 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_001e92d1:
    uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
    uVar13 = 0;
    if (uVar7 - 1 < 0x7f) {
      uVar13 = 0x100000000;
    }
    uVar13 = uVar7 | uVar13;
  }
  uVar7 = (uint32)uVar13;
  if ((uVar13 & 0x100000000) == 0) goto switchD_001e932f_caseD_8;
  cVar12 = (char)uVar13;
  switch((uint)(uVar13 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar12 == '\t') {
      clear_ImputedValue(this);
      pIVar3 = (ImputedValueUnion *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pIVar3 < 8) {
        bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                          (input,(uint64 *)&local_40.imputedint64value_);
        IVar16 = local_40;
        if (!bVar6) {
          return false;
        }
      }
      else {
        IVar16 = *pIVar3;
        input->buffer_ = (uint8 *)(pIVar3 + 1);
      }
      this->ImputedValue_ = IVar16;
      this->_oneof_case_[0] = 1;
      goto LAB_001e92ae;
    }
    break;
  case 2:
    if (cVar12 == '\x10') {
      clear_ImputedValue(this);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9))
      {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar17 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      (this->ImputedValue_).imputedint64value_ = uVar9;
      this->_oneof_case_[0] = 2;
      goto LAB_001e92ae;
    }
    break;
  case 3:
    if (cVar12 != '\x1a') break;
    if (this->_oneof_case_[0] == 3) {
      pDVar10 = this_00->imputeddoublearray_;
      if (pDVar10 ==
          (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
      goto LAB_001e951f;
    }
    else {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 3;
      (this->ImputedValue_).imputeddoublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
LAB_001e951f:
      google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                (&this_00->imputedstringvalue_,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      pDVar10 = this_00->imputeddoublearray_;
    }
    pDVar14 = (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,(string *)pDVar10);
    if (!bVar6) {
      return false;
    }
    if (this->_oneof_case_[0] == 3) {
      pDVar14 = (this->ImputedValue_).imputeddoublearray_;
    }
    data = (pDVar14->super_MessageLite)._vptr_MessageLite;
    iVar8 = *(int *)&(pDVar14->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                     .ptr_;
    field_name = "CoreML.Specification.Imputer.imputedStringValue";
LAB_001e96fe:
    bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      ((char *)data,iVar8,PARSE,field_name);
    if (!bVar6) {
      return false;
    }
    goto LAB_001e92ae;
  case 4:
    if (cVar12 != '\"') break;
    if (this->_oneof_case_[0] == 4) {
      pDVar10 = this_00->imputeddoublearray_;
    }
    else {
      clear_ImputedValue(this);
      this->_oneof_case_[0] = 4;
      pDVar10 = (DoubleVector *)operator_new(0x28);
      DoubleVector::DoubleVector(pDVar10);
      this_00->imputeddoublearray_ = pDVar10;
    }
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
      input->buffer_ = puVar4 + 1;
    }
    else {
      iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (iVar8 < 0) {
        return false;
      }
    }
    pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                       (input,iVar8);
    if ((long)pVar11 < 0) {
      return false;
    }
    bVar6 = DoubleVector::MergePartialFromCodedStream(pDVar10,input);
LAB_001e9819:
    if (bVar6 == false) {
      return false;
    }
    bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar11.first);
    goto LAB_001e9313;
  case 5:
    if (cVar12 == '*') {
      if (this->_oneof_case_[0] == 5) {
        this_03 = this_00->imputedint64array_;
      }
      else {
        clear_ImputedValue(this);
        this->_oneof_case_[0] = 5;
        this_03 = (Int64Vector *)operator_new(0x28);
        Int64Vector::Int64Vector(this_03);
        this_00->imputedint64array_ = this_03;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar8);
      if ((long)pVar11 < 0) {
        return false;
      }
      bVar6 = Int64Vector::MergePartialFromCodedStream(this_03,input);
      goto LAB_001e9819;
    }
    break;
  case 6:
    if (cVar12 == '2') {
      if (this->_oneof_case_[0] == 6) {
        this_01 = this_00->imputedstringdictionary_;
      }
      else {
        clear_ImputedValue(this);
        this->_oneof_case_[0] = 6;
        this_01 = (StringToDoubleMap *)operator_new(0x38);
        StringToDoubleMap::StringToDoubleMap(this_01);
        this_00->imputedstringdictionary_ = this_01;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar8);
      if ((long)pVar11 < 0) {
        return false;
      }
      bVar6 = StringToDoubleMap::MergePartialFromCodedStream(this_01,input);
      goto LAB_001e9819;
    }
    break;
  case 7:
    if (cVar12 == ':') {
      if (this->_oneof_case_[0] == 7) {
        this_02 = this_00->imputedint64dictionary_;
      }
      else {
        clear_ImputedValue(this);
        this->_oneof_case_[0] = 7;
        this_02 = (Int64ToDoubleMap *)operator_new(0x38);
        Int64ToDoubleMap::Int64ToDoubleMap(this_02);
        this_00->imputedint64dictionary_ = this_02;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar11 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar8);
      if ((long)pVar11 < 0) {
        return false;
      }
      bVar6 = Int64ToDoubleMap::MergePartialFromCodedStream(this_02,input);
      goto LAB_001e9819;
    }
    break;
  case 0xb:
    if (cVar12 == 'Y') {
      clear_ReplaceValue(this);
      pIVar3 = (ImputedValueUnion *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pIVar3 < 8) {
        bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                          (input,(uint64 *)&local_40.imputedint64value_);
        IVar16 = local_40;
        if (!bVar6) {
          return false;
        }
      }
      else {
        IVar16 = *pIVar3;
        input->buffer_ = (uint8 *)(pIVar3 + 1);
      }
      this->ReplaceValue_ = (ReplaceValueUnion)IVar16;
      this->_oneof_case_[1] = 0xb;
      goto LAB_001e92ae;
    }
    break;
  case 0xc:
    if (cVar12 == '`') {
      clear_ReplaceValue(this);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9))
      {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar17 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar9 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      (this->ReplaceValue_).replaceint64value_ = uVar9;
      this->_oneof_case_[1] = 0xc;
      goto LAB_001e92ae;
    }
    break;
  case 0xd:
    if (cVar12 == 'j') {
      if (this->_oneof_case_[1] == 0xd) {
        value.replacestringvalue_.ptr_ = (ArenaStringPtr)local_38->replaceint64value_;
        if ((string *)value.replaceint64value_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        goto LAB_001e96bc;
      }
      else {
        clear_ReplaceValue(this);
        this->_oneof_case_[1] = 0xd;
        (this->ReplaceValue_).replacedoublevalue_ =
             (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
LAB_001e96bc:
        pRVar5 = local_38;
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (&local_38->replacestringvalue_,
                   (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        value.replacestringvalue_.ptr_ = *(ArenaStringPtr *)pRVar5;
      }
      puVar15 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,(string *)value);
      if (!bVar6) {
        return false;
      }
      if (this->_oneof_case_[1] == 0xd) {
        puVar15 = (undefined8 *)(this->ReplaceValue_).replaceint64value_;
      }
      data = (_func_int **)*puVar15;
      iVar8 = *(int *)(puVar15 + 1);
      field_name = "CoreML.Specification.Imputer.replaceStringValue";
      goto LAB_001e96fe;
    }
  }
switchD_001e932f_caseD_8:
  if (uVar7 == 0) {
    return true;
  }
  if ((uVar7 & 7) == 4) {
    return true;
  }
  bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_001e9313:
  if (bVar6 == false) {
    return false;
  }
  goto LAB_001e92ae;
}

Assistant:

bool Imputer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Imputer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double imputedDoubleValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(9u)) {
          clear_ImputedValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &ImputedValue_.imputeddoublevalue_)));
          set_has_imputeddoublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 imputedInt64Value = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          clear_ImputedValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &ImputedValue_.imputedint64value_)));
          set_has_imputedint64value();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string imputedStringValue = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_imputedstringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->imputedstringvalue().data(), this->imputedstringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Imputer.imputedStringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputeddoublearray()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedint64array()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedstringdictionary()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedint64dictionary()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double replaceDoubleValue = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(89u)) {
          clear_ReplaceValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &ReplaceValue_.replacedoublevalue_)));
          set_has_replacedoublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 replaceInt64Value = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          clear_ReplaceValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &ReplaceValue_.replaceint64value_)));
          set_has_replaceint64value();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string replaceStringValue = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_replacestringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->replacestringvalue().data(), this->replacestringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Imputer.replaceStringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Imputer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Imputer)
  return false;
#undef DO_
}